

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O0

uint8_t * __thiscall MPEGGOPHeader::deserialize(MPEGGOPHeader *this,uint8_t *buf,int64_t buf_size)

{
  bool bVar1;
  uchar uVar2;
  uint8_t *puVar3;
  undefined1 local_40 [8];
  BitStreamReader bitReader;
  int64_t buf_size_local;
  uint8_t *buf_local;
  MPEGGOPHeader *this_local;
  
  bitReader._24_8_ = buf_size;
  BitStreamReader::BitStreamReader((BitStreamReader *)local_40);
  BitStreamReader::setBuffer((BitStreamReader *)local_40,buf,buf + bitReader._24_8_);
  bVar1 = BitStreamReader::getBit((BitStreamReader *)local_40);
  this->drop_frame_flag = (uint)bVar1;
  uVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,5);
  this->time_code_hours = uVar2;
  uVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,6);
  this->time_code_minutes = uVar2;
  BitStreamReader::skipBit((BitStreamReader *)local_40);
  uVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,6);
  this->time_code_seconds = uVar2;
  uVar2 = BitStreamReader::getBits<unsigned_char>((BitStreamReader *)local_40,6);
  this->time_code_pictures = uVar2;
  bVar1 = BitStreamReader::getBit((BitStreamReader *)local_40);
  this->close_gop = (uint)bVar1;
  bVar1 = BitStreamReader::getBit((BitStreamReader *)local_40);
  this->broken_link = (uint)bVar1;
  puVar3 = MPEGHeader::skipProcessedBytes((BitStreamReader *)local_40);
  return puVar3;
}

Assistant:

uint8_t* MPEGGOPHeader::deserialize(uint8_t* buf, const int64_t buf_size)
{
    BitStreamReader bitReader{};
    bitReader.setBuffer(buf, buf + buf_size);

    drop_frame_flag = bitReader.getBit();

    time_code_hours = bitReader.getBits<uint8_t>(5);
    time_code_minutes = bitReader.getBits<uint8_t>(6);
    bitReader.skipBit();  // marker bit
    time_code_seconds = bitReader.getBits<uint8_t>(6);
    time_code_pictures = bitReader.getBits<uint8_t>(6);

    close_gop = bitReader.getBit();
    /*broken_link indicate that after editing the
      reference frames of the first B-Frames after GOP I-Frame
      are missing (open gop)*/
    broken_link = bitReader.getBit();

    return skipProcessedBytes(bitReader);
}